

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O0

bool __thiscall
rapidjson::internal::BigInteger::Difference(BigInteger *this,BigInteger *rhs,BigInteger *out)

{
  int iVar1;
  RapidJSONException *this_00;
  ulong local_68;
  Type d;
  size_t i;
  Type borrow;
  BigInteger *pBStack_48;
  bool ret;
  BigInteger *b;
  BigInteger *a;
  int cmp;
  BigInteger *out_local;
  BigInteger *rhs_local;
  BigInteger *this_local;
  
  iVar1 = Compare(this,rhs);
  if (iVar1 == 0) {
    this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this_00,"rapidjson internal assertion failure: cmp != 0");
    __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,
                cereal::RapidJSONException::~RapidJSONException);
  }
  pBStack_48 = rhs;
  b = this;
  if (iVar1 < 0) {
    pBStack_48 = this;
    b = rhs;
  }
  i = 0;
  for (d = 0; d < b->count_; d = d + 1) {
    local_68 = b->digits_[d] - i;
    if (d < pBStack_48->count_) {
      local_68 = local_68 - pBStack_48->digits_[d];
    }
    i = (size_t)(int)(uint)(b->digits_[d] < local_68);
    out->digits_[d] = local_68;
    if (local_68 != 0) {
      out->count_ = d + 1;
    }
  }
  return iVar1 < 0;
}

Assistant:

bool Difference(const BigInteger& rhs, BigInteger* out) const {
        int cmp = Compare(rhs);
        CEREAL_RAPIDJSON_ASSERT(cmp != 0);
        const BigInteger *a, *b;  // Makes a > b
        bool ret;
        if (cmp < 0) { a = &rhs; b = this; ret = true; }
        else         { a = this; b = &rhs; ret = false; }

        Type borrow = 0;
        for (size_t i = 0; i < a->count_; i++) {
            Type d = a->digits_[i] - borrow;
            if (i < b->count_)
                d -= b->digits_[i];
            borrow = (d > a->digits_[i]) ? 1 : 0;
            out->digits_[i] = d;
            if (d != 0)
                out->count_ = i + 1;
        }

        return ret;
    }